

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  Waiter *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RCX;
  undefined8 *puVar3;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  char *pcVar4;
  ReadableDirectory *pRVar5;
  ReadableDirectory *extraout_RDX_02;
  ReadableDirectory *extraout_RDX_03;
  ReadableDirectory *extraout_RDX_04;
  ReadableDirectory *extraout_RDX_05;
  ReadableDirectory *extraout_RDX_06;
  InMemoryFileFactory *pIVar6;
  Exception *pEVar7;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar8;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar9;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_48;
  _Base_ptr p_Stack_40;
  
  puVar3 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    this_00 = (Waiter *)(name_00.content.ptr + 1);
    local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
    kj::_::Mutex::lock((Mutex *)this_00,1);
    p_Stack_40 = (_Base_ptr)(name_00.content.ptr + 2);
    if (puVar3[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar3;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)p_Stack_40;
    local_48.ptr = this_00;
    Impl::tryGetEntry((Impl *)local_68,name);
    if ((Exception *)local_68._0_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pRVar5 = extraout_RDX_00;
    }
    else if (*(int *)(local_68._0_8_ + 0x18) == 3) {
      SymlinkNode::parse((Path *)local_68,(SymlinkNode *)(local_68._0_8_ + 0x20));
      kj::_::Mutex::unlock((Mutex *)this_00,SHARED,(Waiter *)0x0);
      local_48.ptr = (Waiter *)0x0;
      p_Stack_40 = (_Base_ptr)0x0;
      path_00.parts.size_ = local_68._0_8_;
      path_00.parts.ptr = name_00.content.ptr;
      MVar9 = tryOpenFile(this,path_00);
      uVar2 = local_68._8_8_;
      uVar1 = local_68._0_8_;
      pRVar5 = (ReadableDirectory *)MVar9.ptr.ptr;
      if ((Exception *)local_68._0_8_ != (Exception *)0x0) {
        local_68._0_8_ = (Exception *)0x0;
        local_68._8_8_ = (InMemoryFileFactory *)0x0;
        (***(_func_int ***)local_68._16_8_)
                  (local_68._16_8_,uVar1,0x18,uVar2,uVar2,
                   ArrayDisposer::Dispose_<kj::String>::destruct);
        pRVar5 = extraout_RDX_03;
      }
    }
    else if (*(int *)(local_68._0_8_ + 0x18) == 1) {
      (**(code **)(*(long *)(((String *)(local_68._0_8_ + 0x28))->content).ptr + 0x28))(local_68);
      pIVar6 = (InMemoryFileFactory *)local_68._8_8_;
      if ((InMemoryFileFactory *)local_68._8_8_ == (InMemoryFileFactory *)0x0) {
        pIVar6 = (InMemoryFileFactory *)0x0;
        pEVar7 = (Exception *)0x0;
      }
      else {
        local_68._8_8_ = (InMemoryFileFactory *)0x0;
        pEVar7 = (Exception *)local_68._0_8_;
      }
      uVar1 = local_68._8_8_;
      pRVar5 = extraout_RDX_01;
      if ((InMemoryFileFactory *)local_68._8_8_ != (InMemoryFileFactory *)0x0) {
        local_68._8_8_ = (InMemoryFileFactory *)0x0;
        (**(code **)(((String *)local_68._0_8_)->content).ptr)
                  (local_68._0_8_,
                   (InMemoryFileFactory *)(uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10)));
        pRVar5 = extraout_RDX_05;
      }
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)pEVar7;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)pIVar6;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x695,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)local_68);
      pRVar5 = extraout_RDX_04;
    }
    if (local_48.ptr != (Waiter *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_48.ptr,SHARED,(Waiter *)0x0);
      pRVar5 = extraout_RDX_06;
    }
  }
  else if (in_RCX == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x439,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_68);
    pRVar5 = extraout_RDX;
  }
  else {
    if (puVar3[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar3;
    }
    name_00.content.size_ = (size_t)pcVar4;
    MVar8 = tryGetParent((InMemoryDirectory *)local_68,name_00);
    pRVar5 = MVar8.ptr.ptr;
    if ((InMemoryFileFactory *)local_68._8_8_ == (InMemoryFileFactory *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_68._8_8_ + 0x50))
                (this,local_68._8_8_,puVar3 + 3,in_RCX + -1);
      (**(code **)(((String *)local_68._0_8_)->content).ptr)
                (local_68._0_8_,
                 (InMemoryFileFactory *)
                 (local_68._8_8_ + *(long *)(*(_func_int **)local_68._8_8_ + -0x10)));
      pRVar5 = extraout_RDX_02;
    }
  }
  MVar9.ptr.ptr = (ReadableFile *)pRVar5;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, entry);
      } else {
        return kj::none;
      }
    }